

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmatch.c
# Opt level: O3

int pmatch(char *p,char *s,uint len)

{
  char *pcVar1;
  char cVar2;
  
  while( true ) {
    while( true ) {
      while( true ) {
        pcVar1 = p + 1;
        cVar2 = *p;
        if (cVar2 != '*') break;
        if (*pcVar1 == '\0') {
          return 1;
        }
        while( true ) {
          if (len == 0) {
            return 0;
          }
          p = pcVar1;
          if (*s == *pcVar1) break;
          s = s + 1;
          len = len - 1;
        }
      }
      if (cVar2 == '+') break;
      if (cVar2 == '\0') {
        return (int)(len == 0);
      }
      if (len == 0) {
        return 0;
      }
      if (*s != cVar2) {
        return 0;
      }
      s = s + 1;
      len = len - 1;
      p = pcVar1;
    }
    pcVar1 = p + 1;
    if (*pcVar1 != *s) {
      return 0;
    }
    if (len == 0) break;
    p = p + 2;
    while (*s == *pcVar1) {
      s = s + 1;
      len = len - 1;
      if (len == 0) {
        return 1;
      }
    }
  }
  return 1;
}

Assistant:

int pmatch(const char *p, const char *s, unsigned int len) {
  for (;;) {
    char c =*p++;
    if (! c) return(! len);
    switch(c) {
    case '*':
      if (! (c =*p)) return(1);
      for (;;) {
        if (! len) return(0);
        if (*s == c) break;
        ++s; --len;
      }
      continue;
    case '+':
      if ((c =*p++) != *s) return(0);
      for (;;) {
        if (! len) return(1);
        if (*s != c) break;
        ++s; --len;
      }
      continue;
      /*
    case '?':
      if (*p == '?') {
        if (*s != '?') return(0);
        ++p;
      }
      ++s; --len;
      continue;
      */
    default:
      if (! len) return(0);
      if (*s != c) return(0);
      ++s; --len;
      continue;
    }
  }
  return(0);
}